

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O3

int __thiscall cmCPackIFWGenerator::RunBinaryCreator(cmCPackIFWGenerator *this,string *ifwTmpFile)

{
  char *pcVar1;
  cmCPackIFWGenerator *pcVar2;
  cmCPackLog *pcVar3;
  _Alloc_hider msg;
  undefined8 uVar4;
  bool bVar5;
  ostream *poVar6;
  size_t sVar7;
  int iVar8;
  int retVal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ifwCmd;
  string output;
  ostringstream cmCPackLog_msg_2;
  ostringstream cmCPackLog_msg;
  int local_46c;
  string local_468;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448;
  string local_430;
  undefined1 local_410 [112];
  ios_base local_3a0 [264];
  undefined1 local_298 [616];
  
  BuildBinaryCreatorCommmand_abi_cxx11_(&local_448,this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"Execute: ",9);
  cmSystemTools::PrintSingleCommand((string *)local_410,&local_448);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_298,(char *)local_410._0_8_,local_410._8_8_);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  pcVar1 = local_410 + 0x10;
  if ((char *)local_410._0_8_ != pcVar1) {
    operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
  }
  pcVar2 = (this->super_cmCPackIFWCommon).Generator;
  if (pcVar2 != (cmCPackIFWGenerator *)0x0) {
    pcVar3 = (pcVar2->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar4 = local_410._0_8_;
    sVar7 = strlen((char *)local_410._0_8_);
    cmCPackLog::Log(pcVar3,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0x11a,(char *)uVar4,sVar7);
    if ((char *)local_410._0_8_ != pcVar1) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
  std::ios_base::~ios_base((ios_base *)(local_298 + 0x70));
  local_430._M_string_length = 0;
  local_430.field_2._M_local_buf[0] = '\0';
  local_46c = 1;
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"- Generate package",0x12)
  ;
  std::ios::widen((char)(ostream *)local_298 + (char)*(_func_int **)(local_298._0_8_ + -0x18));
  std::ostream::put((char)local_298);
  std::ostream::flush();
  pcVar2 = (this->super_cmCPackIFWCommon).Generator;
  if (pcVar2 != (cmCPackIFWGenerator *)0x0) {
    pcVar3 = (pcVar2->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar4 = local_410._0_8_;
    sVar7 = strlen((char *)local_410._0_8_);
    cmCPackLog::Log(pcVar3,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0x11d,(char *)uVar4,sVar7);
    if ((char *)local_410._0_8_ != pcVar1) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
  std::ios_base::~ios_base((ios_base *)(local_298 + 0x70));
  bVar5 = cmSystemTools::RunSingleCommand
                    (&local_448,&local_430,&local_430,&local_46c,(char *)0x0,
                     (this->super_cmCPackGenerator).GeneratorVerbose,(cmDuration)0x0,Auto);
  iVar8 = 1;
  if (!bVar5 || local_46c != 0) {
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_298,ifwTmpFile,false,None);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"# Run command: ",0xf);
    cmSystemTools::PrintSingleCommand((string *)local_410,&local_448);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_298,(char *)local_410._0_8_,local_410._8_8_);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"# Output:",9);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    poVar6 = (ostream *)std::ostream::flush();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_430._M_dataplus._M_p,local_430._M_string_length);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((char *)local_410._0_8_ != pcVar1) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_410,"Problem running IFW command: ",0x1d);
    cmSystemTools::PrintSingleCommand(&local_468,&local_448);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_410,local_468._M_dataplus._M_p,local_468._M_string_length);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Please check \"",0xe);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(ifwTmpFile->_M_dataplus)._M_p,ifwTmpFile->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" for errors",0xc);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (this->super_cmCPackIFWCommon).Generator;
    if (pcVar2 != (cmCPackIFWGenerator *)0x0) {
      pcVar3 = (pcVar2->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      msg._M_p = local_468._M_dataplus._M_p;
      sVar7 = strlen(local_468._M_dataplus._M_p);
      cmCPackLog::Log(pcVar3,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                      ,299,msg._M_p,sVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
    std::ios_base::~ios_base(local_3a0);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
    iVar8 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,
                    CONCAT71(local_430.field_2._M_allocated_capacity._1_7_,
                             local_430.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_448);
  return iVar8;
}

Assistant:

int cmCPackIFWGenerator::RunBinaryCreator(const std::string& ifwTmpFile)
{
  std::vector<std::string> ifwCmd = this->BuildBinaryCreatorCommmand();
  cmCPackIFWLogger(VERBOSE,
                   "Execute: " << cmSystemTools::PrintSingleCommand(ifwCmd)
                               << std::endl);
  std::string output;
  int retVal = 1;
  cmCPackIFWLogger(OUTPUT, "- Generate package" << std::endl);
  bool res = cmSystemTools::RunSingleCommand(ifwCmd, &output, &output, &retVal,
                                             nullptr, this->GeneratorVerbose,
                                             cmDuration::zero());
  if (!res || retVal) {
    cmGeneratedFileStream ofs(ifwTmpFile);
    ofs << "# Run command: " << cmSystemTools::PrintSingleCommand(ifwCmd)
        << std::endl
        << "# Output:" << std::endl
        << output << std::endl;
    cmCPackIFWLogger(
      ERROR,
      "Problem running IFW command: "
        << cmSystemTools::PrintSingleCommand(ifwCmd) << std::endl
        << "Please check \"" << ifwTmpFile << "\" for errors" << std::endl);
    return 0;
  }

  return 1;
}